

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *in,QByteArray *ba)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  long lVar3;
  qint64 qVar4;
  long lVar5;
  undefined1 *puVar6;
  long len;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  undefined1 *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((ba->d).d)->super_QArrayData;
  (ba->d).d = (Data *)0x0;
  (ba->d).ptr = (char *)0x0;
  (ba->d).size = 0;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(in,(qint32 *)&local_3c);
  puVar6 = (undefined1 *)(ulong)local_3c;
  if (puVar6 == (undefined1 *)0xffffffff) {
    puVar6 = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < in->ver)) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in,(qint64 *)&local_48);
    puVar6 = local_48;
  }
  if ((long)puVar6 < -1) {
    pQVar1 = &((ba->d).d)->super_QArrayData;
    (ba->d).d = (Data *)0x0;
    (ba->d).ptr = (char *)0x0;
    (ba->d).size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
    QDataStream::setStatus(in,SizeLimitExceeded);
  }
  else if (puVar6 == (undefined1 *)0xffffffffffffffff) {
    pQVar1 = &((ba->d).d)->super_QArrayData;
    (ba->d).d = (Data *)0x0;
    (ba->d).ptr = (char *)0x0;
    (ba->d).size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  else {
    lVar5 = 0;
    do {
      len = (long)puVar6 - lVar5;
      if (0xfffff < len) {
        len = 0x100000;
      }
      QByteArray::resize(ba,len + lVar5);
      pDVar2 = (ba->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(ba,(ba->d).size,KeepSize);
      }
      qVar4 = QDataStream::readRawData(in,(ba->d).ptr + lVar5,len);
      lVar3 = len + lVar5;
      if (qVar4 != len) {
        pQVar1 = &((ba->d).d)->super_QArrayData;
        (ba->d).d = (Data *)0x0;
        (ba->d).ptr = (char *)0x0;
        (ba->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,1,0x10);
          }
        }
        QDataStream::setStatus(in,ReadPastEnd);
        lVar3 = lVar5;
      }
      lVar5 = lVar3;
    } while ((qVar4 == len) && (lVar5 < (long)puVar6));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QByteArray &ba)
{
    ba.clear();

    qint64 size = QDataStream::readQSizeType(in);
    qsizetype len = size;
    if (size != len || size < -1) {
        ba.clear();
        in.setStatus(QDataStream::SizeLimitExceeded);
        return in;
    }
    if (len == -1) { // null byte-array
        ba = QByteArray();
        return in;
    }

    constexpr qsizetype Step = 1024 * 1024;
    qsizetype allocated = 0;

    do {
        qsizetype blockSize = qMin(Step, len - allocated);
        ba.resize(allocated + blockSize);
        if (in.readRawData(ba.data() + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    } while (allocated < len);

    return in;
}